

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityType.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::EntityType::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,EntityType *this)

{
  ostream *poVar1;
  KStringStream ss;
  allocator<char> local_1d9;
  KString local_1d8;
  KString local_1b8;
  stringstream local_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(local_198);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,",",&local_1d9);
  CreateTokenisedString(&local_1b8,this,&local_1d8);
  poVar1 = std::operator<<(local_188,(string *)&local_1b8);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

KString EntityType::GetAsString() const
{
    KStringStream ss;

    ss << CreateTokenisedString() << "\n";

    return ss.str();
}